

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

from_chars_result __thiscall
semver::detail::parse<short,short,short>
          (detail *this,string_view str,version<short,_short,_short> *out)

{
  pointer ptVar1;
  undefined1 auVar2 [12];
  char *pcVar3;
  size_t sVar4;
  undefined4 uVar5;
  from_chars_result fVar6;
  token_stream token_stream;
  lexer local_38;
  
  local_38.text_._M_str = (char *)str._M_len;
  token_stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  token_stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token_stream.current = 0;
  token_stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.current_pos_ = 0;
  local_38.text_._M_len = (size_t)this;
  fVar6 = lexer::scan_tokens(&local_38,&token_stream);
  auVar2 = fVar6.super_from_chars_result._0_12_;
  if (fVar6.super_from_chars_result.ec == 0) {
    local_38.text_._M_len = (size_t)&token_stream;
    fVar6 = version_parser::parse<short,short,short>
                      ((version_parser *)&local_38,(version<short,_short,_short> *)str._M_str);
    auVar2 = fVar6.super_from_chars_result._0_12_;
    if (fVar6.super_from_chars_result.ec == 0) {
      sVar4 = token_stream.current + 1;
      ptVar1 = token_stream.tokens.
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start + token_stream.current;
      pcVar3 = token_stream.tokens.
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start[token_stream.current].lexeme;
      uVar5 = 0x16;
      token_stream.current = sVar4;
      if (ptVar1->type == eol) {
        uVar5 = 0;
      }
      goto LAB_00151323;
    }
  }
  pcVar3 = auVar2._0_8_;
  uVar5 = auVar2._8_4_;
LAB_00151323:
  std::_Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>::~_Vector_base
            (&token_stream.tokens.
              super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>);
  fVar6.super_from_chars_result.ec = uVar5;
  fVar6.super_from_chars_result.ptr = pcVar3;
  fVar6.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar6.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(std::string_view str, version<I1, I2, I3>& out) {
  token_stream token_stream;
  from_chars_result result = lexer{ str }.scan_tokens(token_stream);
  if (!result) {
    return result;
  }

  result = version_parser{ token_stream }.parse(out);
  if (!result) {
    return result;
  }

  if (!token_stream.consume(token_type::eol)) {
    return failure(token_stream.previous().lexeme);
  }

  return success(token_stream.previous().lexeme);
}